

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O3

Expression * __thiscall wasm::Builder::makeConstantExpression(Builder *this,Literals *values)

{
  Type *this_00;
  TupleMake *pTVar1;
  long lVar2;
  Literal *pLVar3;
  long lVar4;
  undefined1 local_c0 [8];
  value_type value;
  Literal local_90;
  Expression *local_78;
  Literal *local_70;
  Literals *local_68;
  long local_60;
  undefined1 auStack_58 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> consts;
  
  local_60 = (*(long *)(values + 0x28) - *(long *)(values + 0x20) >> 3) * -0x5555555555555555 +
             *(long *)values;
  if (local_60 == 1) {
    wasm::Literal::Literal(&local_90,(Literal *)(values + 8));
    pTVar1 = (TupleMake *)makeConstantExpression(this,&local_90);
    wasm::Literal::~Literal(&local_90);
  }
  else {
    if (local_60 == 0) {
      __assert_fail("values.size() > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-builder.h"
                    ,0x512,"Expression *wasm::Builder::makeConstantExpression(Literals)");
    }
    auStack_58 = (undefined1  [8])0x0;
    consts.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    consts.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_70 = (Literal *)(values + 8);
    lVar2 = -0x18;
    lVar4 = 0;
    local_68 = values;
    do {
      pLVar3 = (Literal *)(*(long *)(local_68 + 0x20) + lVar2);
      if (lVar4 == 0) {
        pLVar3 = local_70;
      }
      wasm::Literal::Literal((Literal *)local_c0,pLVar3);
      this_00 = &value.type;
      wasm::Literal::Literal((Literal *)this_00,(Literal *)local_c0);
      local_78 = makeConstantExpression(this,(Literal *)this_00);
      std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
      emplace_back<wasm::Expression*>
                ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_58,&local_78
                );
      wasm::Literal::~Literal((Literal *)this_00);
      wasm::Literal::~Literal((Literal *)local_c0);
      lVar4 = lVar4 + 1;
      lVar2 = lVar2 + 0x18;
    } while (local_60 != lVar4);
    pTVar1 = makeTupleMake<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>&>
                       (this,(vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                             auStack_58);
    if (auStack_58 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_58,
                      (long)consts.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_58);
    }
  }
  return (Expression *)pTVar1;
}

Assistant:

Expression* makeConstantExpression(Literals values) {
    assert(values.size() > 0);
    if (values.size() == 1) {
      return makeConstantExpression(values[0]);
    } else {
      std::vector<Expression*> consts;
      for (auto value : values) {
        consts.push_back(makeConstantExpression(value));
      }
      return makeTupleMake(consts);
    }
  }